

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O2

void highbd_paeth_predictor
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t top_left;
  uint16_t uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar4 = uVar5;
  }
  uVar2 = (ulong)(uint)bh;
  if (bh < 1) {
    uVar2 = uVar5;
  }
  top_left = above[-1];
  for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar1 = paeth_predictor_single(left[uVar5],above[uVar3],top_left);
      dst[uVar3] = uVar1;
    }
    dst = dst + stride;
  }
  return;
}

Assistant:

static inline void highbd_paeth_predictor(uint16_t *dst, ptrdiff_t stride,
                                          int bw, int bh, const uint16_t *above,
                                          const uint16_t *left, int bd) {
  int r, c;
  const uint16_t ytop_left = above[-1];
  (void)bd;

  for (r = 0; r < bh; r++) {
    for (c = 0; c < bw; c++)
      dst[c] = paeth_predictor_single(left[r], above[c], ytop_left);
    dst += stride;
  }
}